

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu32 pager_cksum(Pager *pPager,uchar *zData)

{
  sxu32 sVar1;
  ulong uVar2;
  
  sVar1 = pPager->cksumInit;
  for (uVar2 = (ulong)(uint)pPager->iPageSize; 200 < (int)uVar2; uVar2 = uVar2 - 200) {
    sVar1 = sVar1 + zData[uVar2 - 200];
  }
  return sVar1;
}

Assistant:

static sxu32 pager_cksum(Pager *pPager,const unsigned char *zData)
{
  sxu32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->iPageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += zData[i];
    i -= 200;
  }
  return cksum;
}